

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool.cpp
# Opt level: O2

bool __thiscall
Function_Pool::FunctionTask::IsEqual
          (FunctionTask *this,Image *in1,uint32_t startX1,uint32_t startY1,Image *in2,
          uint32_t startX2,uint32_t startY2,uint32_t width,uint32_t height)

{
  bool bVar1;
  size_t count;
  
  FunctionPoolTask::_setup
            (&this->super_FunctionPoolTask,in1,startX1,startY1,in2,startX2,startY2,width,height);
  count = AreaInfo::_size(&((this->super_FunctionPoolTask)._infoIn1._M_t.
                            super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
                            .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>.
                           _M_head_impl)->super_AreaInfo);
  OutputInfo::resize(&this->_dataOut,count);
  this->functionId = _IsEqual;
  FunctionPoolTask::_processTask(&this->super_FunctionPoolTask);
  bVar1 = OutputInfo::isEqual(&this->_dataOut);
  return bVar1;
}

Assistant:

bool IsEqual( const Image & in1, uint32_t startX1, uint32_t startY1, const Image & in2, uint32_t startX2, uint32_t startY2,
                      uint32_t width, uint32_t height )
        {
            _setup( in1, startX1, startY1, in2, startX2, startY2, width, height );
            _dataOut.resize( _infoIn1->_size() );
            _process( _IsEqual );
            return _dataOut.isEqual();
        }